

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::EventLog::SetModeFlagsOnContext(EventLog *this,ScriptContext *ctx)

{
  TTDMode TVar1;
  TTDMode TVar2;
  TTDMode TVar3;
  TTDMode cm;
  ScriptContext *ctx_local;
  EventLog *this_local;
  
  TVar3 = this->m_currentMode;
  TVar1 = operator|(RecordMode,AnyExcludedMode);
  TVar1 = TTD::operator&(TVar3,TVar1);
  ctx->TTDRecordModeEnabled = TVar1 == RecordMode;
  TVar1 = operator|(ReplayMode,AnyExcludedMode);
  TVar1 = TTD::operator&(TVar3,TVar1);
  ctx->TTDReplayModeEnabled = TVar1 == ReplayMode;
  ctx->TTDRecordOrReplayModeEnabled =
       (ctx->TTDRecordModeEnabled & 1U) != 0 || (ctx->TTDReplayModeEnabled & 1U) != 0;
  TVar1 = operator|(RecordMode,CurrentlyEnabled);
  TVar1 = operator|(TVar1,AnyExcludedMode);
  TVar1 = TTD::operator&(TVar3,TVar1);
  TVar2 = operator|(RecordMode,CurrentlyEnabled);
  ctx->TTDShouldPerformRecordAction = TVar1 == TVar2;
  TVar1 = operator|(ReplayMode,CurrentlyEnabled);
  TVar1 = operator|(TVar1,AnyExcludedMode);
  TVar1 = TTD::operator&(TVar3,TVar1);
  TVar2 = operator|(ReplayMode,CurrentlyEnabled);
  ctx->TTDShouldPerformReplayAction = TVar1 == TVar2;
  ctx->TTDShouldPerformRecordOrReplayAction =
       (ctx->TTDShouldPerformRecordAction & 1U) != 0 ||
       (ctx->TTDShouldPerformReplayAction & 1U) != 0;
  TVar1 = operator|(RecordDebuggerMode,CurrentlyEnabled);
  TVar1 = operator|(TVar1,AnyExcludedMode);
  TVar1 = TTD::operator&(TVar3,TVar1);
  TVar2 = operator|(RecordDebuggerMode,CurrentlyEnabled);
  ctx->TTDShouldPerformRecordDebuggerAction = TVar1 == TVar2;
  TVar1 = operator|(ReplayDebuggerMode,CurrentlyEnabled);
  TVar1 = operator|(TVar1,AnyExcludedMode);
  TVar1 = TTD::operator&(TVar3,TVar1);
  TVar2 = operator|(ReplayDebuggerMode,CurrentlyEnabled);
  ctx->TTDShouldPerformReplayDebuggerAction = TVar1 == TVar2;
  ctx->TTDShouldPerformRecordOrReplayDebuggerAction =
       (ctx->TTDShouldPerformRecordDebuggerAction & 1U) != 0 ||
       (ctx->TTDShouldPerformReplayDebuggerAction & 1U) != 0;
  TVar3 = TTD::operator&(TVar3,DebuggerSuppressGetter);
  ctx->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = TVar3 == DebuggerSuppressGetter;
  return;
}

Assistant:

void EventLog::SetModeFlagsOnContext(Js::ScriptContext* ctx)
    {
        TTDMode cm = this->m_currentMode;

        ctx->TTDRecordModeEnabled = (cm & (TTDMode::RecordMode | TTDMode::AnyExcludedMode)) == TTDMode::RecordMode;
        ctx->TTDReplayModeEnabled = (cm & (TTDMode::ReplayMode | TTDMode::AnyExcludedMode)) == TTDMode::ReplayMode;
        ctx->TTDRecordOrReplayModeEnabled = (ctx->TTDRecordModeEnabled | ctx->TTDReplayModeEnabled);

        ctx->TTDShouldPerformRecordAction = (cm & (TTDMode::RecordMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformReplayAction = (cm & (TTDMode::ReplayMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::ReplayMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformRecordOrReplayAction = (ctx->TTDShouldPerformRecordAction | ctx->TTDShouldPerformReplayAction);

        ctx->TTDShouldPerformRecordDebuggerAction = (cm & (TTDMode::RecordDebuggerMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::RecordDebuggerMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformReplayDebuggerAction = (cm & ( TTDMode::ReplayDebuggerMode | TTDMode::CurrentlyEnabled | TTDMode::AnyExcludedMode)) == (TTDMode::ReplayDebuggerMode | TTDMode::CurrentlyEnabled);
        ctx->TTDShouldPerformRecordOrReplayDebuggerAction = (ctx->TTDShouldPerformRecordDebuggerAction | ctx->TTDShouldPerformReplayDebuggerAction);

        ctx->TTDShouldSuppressGetterInvocationForDebuggerEvaluation = (cm & TTDMode::DebuggerSuppressGetter) == TTDMode::DebuggerSuppressGetter;
    }